

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall WhiteRoomOneAction::Touch(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *this_01;
  string *this_02;
  itemType local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == DISCUS) {
    local_7c = DISCUS;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_7c);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == BACKPACK) {
      this_01 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,"It\'s slick, like butter. It\'s also shiny, as in reflective."
                 ,(allocator *)&local_7c);
      ActionResults::ActionResults(this_01,CURRENT,&local_38);
      this_02 = &local_38;
      goto LAB_0011ea7f;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  this_01 = (ActionResults *)operator_new(0x30);
  if (iVar1 == LIGHT) {
    std::__cxx11::string::string
              ((string *)&local_58,
               "You wave your hand aimlessly in the air. Good thing no one is watching.",
               (allocator *)&local_7c);
    ActionResults::ActionResults(this_01,CURRENT,&local_58);
    this_02 = &local_58;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_78,"That was touching, but ineffective.",(allocator *)&local_7c);
    ActionResults::ActionResults(this_01,CURRENT,&local_78);
    this_02 = &local_78;
  }
LAB_0011ea7f:
  std::__cxx11::string::~string((string *)this_02);
  return this_01;
}

Assistant:

ActionResults * WhiteRoomOneAction::Touch() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() == BACKPACK) {
        return new ActionResults(CURRENT, "It's slick, like butter. It's also shiny, as in reflective.");
    }
    else if(commands->getMainItem() == LIGHT){
        return new ActionResults(CURRENT, "You wave your hand aimlessly in the air. Good thing no one is watching.");
    }
    else {
        return new ActionResults(CURRENT, "That was touching, but ineffective.");
    }
}